

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_search_localfile
                 (char **searchpaths,ly_bool cwd,char *name,char *revision,char **localfile,
                 LYS_INFORMAT *format)

{
  char cVar1;
  LY_ERR LVar2;
  byte bVar3;
  LY_ERR LVar4;
  int iVar5;
  lyd_node *__name;
  DIR *__dirp;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  dirent *pdVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  LYS_INFORMAT LVar13;
  undefined7 in_register_00000031;
  ly_set *set;
  long lVar14;
  char **ppcVar15;
  bool bVar16;
  ly_set *dirs;
  char *match_name;
  char *str;
  stat st;
  LYS_INFORMAT local_124;
  ly_set *local_120;
  char *local_118;
  LYS_INFORMAT local_110;
  undefined4 local_10c;
  char *local_108;
  ly_set *local_100;
  long local_f8;
  long local_f0;
  size_t local_e8;
  ulong local_e0;
  char **local_d8;
  LYS_INFORMAT *local_d0;
  char *local_c8;
  stat local_c0;
  
  local_118 = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","localfile",
           "lys_search_localfile");
    return LY_EINVAL;
  }
  __name = (lyd_node *)(CONCAT71(in_register_00000031,cwd) & 0xffffffff);
  local_c8 = revision;
  LVar4 = ly_set_new(&local_120);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  local_e8 = strlen(name);
  if ((char)__name == '\0') {
    LVar4 = LY_EMEM;
    local_10c = 0;
LAB_0015d4a2:
    local_d8 = localfile;
    local_d0 = format;
    if (searchpaths != (char **)0x0) {
      pcVar8 = *searchpaths;
      bVar16 = pcVar8 == (char *)0x0;
      if (!bVar16) {
        ppcVar15 = searchpaths + 1;
        do {
          if (((char)local_10c == '\0') ||
             (iVar5 = strcmp((char *)*(local_120->field_2).dnodes,pcVar8), iVar5 != 0)) {
            __name = (lyd_node *)strdup(pcVar8);
            if (__name == (lyd_node *)0x0) {
              __name = (lyd_node *)0x0;
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_search_localfile");
              break;
            }
            LVar4 = ly_set_add(local_120,__name,'\0',(uint32_t *)0x0);
            LVar2 = LY_SUCCESS;
            if (LVar4 != LY_SUCCESS) break;
          }
          else {
            local_10c = 0;
            LVar2 = LVar4;
          }
          LVar4 = LVar2;
          pcVar8 = *ppcVar15;
          ppcVar15 = ppcVar15 + 1;
          bVar16 = pcVar8 == (char *)0x0;
        } while (!bVar16);
      }
      if (!bVar16) goto LAB_0015d9dc;
    }
    __name = (lyd_node *)0x0;
    if (local_120->count == 0) {
      __dirp = (DIR *)0x0;
      local_124 = LYS_IN_UNKNOWN;
    }
    else {
      local_f0 = local_e8 + 1;
      local_e0 = ~local_e8;
      local_124 = LYS_IN_UNKNOWN;
      __dirp = (DIR *)0x0;
      __name = (lyd_node *)0x0;
      local_f8 = 0;
      do {
        while( true ) {
          free(__name);
          uVar12 = local_120->count - 1;
          local_120->count = uVar12;
          __name = (local_120->field_2).dnodes[uVar12];
          (local_120->field_2).dnodes[uVar12] = (lyd_node *)0x0;
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in \"%s\".",name,__name);
          if (__dirp != (DIR *)0x0) {
            closedir(__dirp);
          }
          __dirp = opendir((char *)__name);
          sVar6 = strlen((char *)__name);
          if (__dirp != (DIR *)0x0) break;
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                 "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar8);
          __dirp = (DIR *)0x0;
          if (local_120->count == 0) {
            __dirp = (DIR *)0x0;
            goto LAB_0015d9ee;
          }
        }
        pdVar9 = readdir(__dirp);
        if (pdVar9 != (dirent *)0x0) {
          lVar14 = sVar6 + local_f0;
          do {
            pcVar8 = pdVar9->d_name;
            iVar5 = strcmp(".",pcVar8);
            if ((iVar5 != 0) && (iVar5 = strcmp("..",pcVar8), iVar5 != 0)) {
              local_108 = (char *)0x0;
              bVar3 = pdVar9->d_type >> 1 | pdVar9->d_type << 7;
              if (bVar3 == 5) {
LAB_0015d6c3:
                local_100 = local_120;
                iVar5 = asprintf(&local_108,"%s/%s",__name,pcVar8);
                if (iVar5 == -1) {
LAB_0015d7ac:
                  LVar4 = LY_EMEM;
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_search_localfile_file_type");
                }
                else {
                  iVar5 = stat(local_108,&local_c0);
                  if (iVar5 == 0) {
                    set = local_100;
                    LVar4 = LY_SUCCESS;
                    if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_0015d750;
                  }
                  else {
                    piVar7 = __errno_location();
                    pcVar10 = strerror(*piVar7);
                    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                           "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                           ,pcVar8,__name,pcVar10);
                    LVar4 = LY_SUCCESS;
                  }
                }
              }
              else {
                set = local_120;
                if (bVar3 == 2) {
LAB_0015d750:
                  if (((char)local_10c == '\0') || (LVar4 = LY_SUCCESS, set->count != 0)) {
                    if ((local_108 == (char *)0x0) &&
                       (iVar5 = asprintf(&local_108,"%s/%s",__name), iVar5 == -1))
                    goto LAB_0015d7ac;
                    LVar4 = ly_set_add(set,local_108,'\0',(uint32_t *)0x0);
                    if (LVar4 == LY_SUCCESS) {
                      local_108 = (char *)0x0;
                      LVar4 = LY_SUCCESS;
                    }
                  }
                }
                else {
                  LVar4 = LY_SUCCESS;
                  if (bVar3 == 0) goto LAB_0015d6c3;
                }
              }
              free(local_108);
              sVar6 = local_e8;
              if (LVar4 != LY_SUCCESS) goto LAB_0015da17;
              iVar5 = strncmp(name,pcVar8,local_e8);
              if ((iVar5 == 0) && ((cVar1 = pcVar8[sVar6], cVar1 == '@' || (cVar1 == '.')))) {
                local_100 = (ly_set *)strlen(pcVar8);
                if ((local_100 < (ly_set *)0x6) ||
                   (iVar5 = strcmp(pcVar8 + (long)((long)&local_100[-1].field_2.dnodes + 3),".yang")
                   , iVar5 != 0)) {
                  if ((local_100 < (ly_set *)0x5) ||
                     (iVar5 = strcmp(pcVar8 + (long)((long)&local_100[-1].field_2.dnodes + 4),".yin"
                                    ), iVar5 != 0)) goto LAB_0015d7fa;
                  LVar13 = LYS_IN_YIN;
                  lVar11 = -4;
                }
                else {
                  LVar13 = LYS_IN_YANG;
                  lVar11 = -5;
                }
                pcVar10 = local_c8;
                if (local_c8 != (char *)0x0) {
                  if (cVar1 != '@') {
                    local_110 = LVar13;
                    free(local_118);
                    iVar5 = asprintf(&local_118,"%s/%s",__name,pcVar8);
                    local_124 = local_110;
                    goto LAB_0015d9af;
                  }
                  local_100 = (ly_set *)(pcVar8 + local_f0);
                  local_110 = LVar13;
                  sVar6 = strlen(local_c8);
                  iVar5 = strncmp(pcVar10,(char *)local_100,sVar6);
                  if (iVar5 != 0) goto LAB_0015d7fa;
                  free(local_118);
                  iVar5 = asprintf(&local_118,"%s/%s",__name,pcVar8);
                  if (iVar5 != -1) {
                    local_124 = local_110;
                    goto LAB_0015d9ee;
                  }
LAB_0015da6d:
                  LVar4 = LY_SUCCESS;
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_search_localfile");
                  goto LAB_0015da17;
                }
                if (local_118 == (char *)0x0) {
LAB_0015d957:
                  iVar5 = asprintf(&local_118,"%s/%s",__name);
                  local_124 = LVar13;
LAB_0015d9af:
                  local_f8 = lVar14;
                  if (iVar5 == -1) goto LAB_0015da6d;
                }
                else if (cVar1 == '@') {
                  pcVar8 = pcVar8 + local_f0;
                  local_110 = LVar13;
                  LVar4 = lysp_check_date((lysp_ctx *)0x0,pcVar8,
                                          (size_t)((long)&local_100->size + lVar11 + local_e0),
                                          (char *)0x0);
                  pcVar10 = local_118;
                  if ((LVar4 == LY_SUCCESS) &&
                     ((local_118[local_f8] != '@' ||
                      (iVar5 = strncmp(local_118 + local_f8 + 1,pcVar8,10), iVar5 < 0)))) {
                    free(pcVar10);
                    LVar13 = local_110;
                    goto LAB_0015d957;
                  }
                }
              }
            }
LAB_0015d7fa:
            pdVar9 = readdir(__dirp);
          } while (pdVar9 != (dirent *)0x0);
        }
      } while (local_120->count != 0);
    }
LAB_0015d9ee:
    *local_d8 = local_118;
    local_118 = (char *)0x0;
    if (local_d0 != (LYS_INFORMAT *)0x0) {
      *local_d0 = local_124;
    }
    LVar4 = LY_SUCCESS;
  }
  else {
    __name = (lyd_node *)get_current_dir_name();
    if (__name != (lyd_node *)0x0) {
      LVar4 = ly_set_add(local_120,__name,'\0',(uint32_t *)0x0);
      if (LVar4 != LY_SUCCESS) {
        __dirp = (DIR *)0x0;
        goto LAB_0015da17;
      }
      local_10c = 1;
      LVar4 = LY_SUCCESS;
      goto LAB_0015d4a2;
    }
    __name = (lyd_node *)0x0;
    LVar4 = LY_EMEM;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
LAB_0015d9dc:
    __dirp = (DIR *)0x0;
  }
LAB_0015da17:
  free(__name);
  if (__dirp != (DIR *)0x0) {
    closedir(__dirp);
  }
  free(local_118);
  ly_set_free(local_120,free);
  return LVar4;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_search_localfile(const char * const *searchpaths, ly_bool cwd, const char *name, const char *revision,
        char **localfile, LYS_INFORMAT *format)
{
    LY_ERR ret = LY_EMEM;
    size_t len, flen, match_len = 0, dir_len;
    ly_bool implicit_cwd = 0, skip;
    char *wd;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    struct ly_set *dirs;

    LY_CHECK_ARG_RET(NULL, localfile, LY_EINVAL);

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    LY_CHECK_RET(ly_set_new(&dirs));

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            ret = ly_set_add(dirs, wd, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (uint64_t i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->objs[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else {
                ret = ly_set_add(dirs, wd, 0, NULL);
                LY_CHECK_GOTO(ret, cleanup);
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->count) {
        free(wd);

        dirs->count--;
        wd = (char *)dirs->objs[dirs->count];
        dirs->objs[dirs->count] = NULL;
        LOGVRB("Searching for \"%s\" in \"%s\".", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
            continue;
        }

        /* search the directory */
        while ((file = readdir(dir))) {
            if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                /* skip . and .. */
                continue;
            }

            /* check whether file type is */
            if ((ret = lys_search_localfile_file_type(file, wd, dirs, implicit_cwd, &skip))) {
                goto cleanup;
            }

            /* here we know that the item is a file which can contain a module */
            if (strncmp(name, file->d_name, len) || ((file->d_name[len] != '.') && (file->d_name[len] != '@'))) {
                /* different filename than the module we search for */
                continue;
            }

            /* get type according to filename suffix */
            flen = strlen(file->d_name);
            if ((flen >= LY_YANG_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YANG_SUFFIX_LEN], LY_YANG_SUFFIX)) {
                format_aux = LYS_IN_YANG;
            } else if ((flen >= LY_YIN_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YIN_SUFFIX_LEN], LY_YIN_SUFFIX)) {
                format_aux = LYS_IN_YIN;
            } else {
                /* not supported suffix/file format */
                continue;
            }

            if (revision) {
                /* we look for the specific revision, try to get it from the filename */
                if (file->d_name[len] == '@') {
                    /* check revision from the filename */
                    if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                        /* another revision */
                        continue;
                    } else {
                        /* exact revision */
                        free(match_name);
                        if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                            LOGMEM(NULL);
                            goto cleanup;
                        }
                        match_len = dir_len + 1 + len;
                        match_format = format_aux;
                        goto success;
                    }
                } else {
                    /* continue trying to find exact revision match, use this only if not found */
                    free(match_name);
                    if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                        LOGMEM(NULL);
                        goto cleanup;
                    }
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            } else {
                /* remember the revision and try to find the newest one */
                if (match_name) {
                    if ((file->d_name[len] != '@') ||
                            lysp_check_date(NULL, &file->d_name[len + 1],
                            flen - ((format_aux == LYS_IN_YANG) ? LY_YANG_SUFFIX_LEN : LY_YIN_SUFFIX_LEN) - len - 1, NULL)) {
                        continue;
                    } else if ((match_name[match_len] == '@') &&
                            (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                        continue;
                    }
                    free(match_name);
                }

                if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                match_len = dir_len + 1 + len;
                match_format = format_aux;
                continue;
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = LY_SUCCESS;

cleanup:
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    ly_set_free(dirs, free);

    return ret;
}